

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O2

int GetLatestDataMES(MES *pMES,double *pDistance)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t __n;
  double dVar5;
  int Bytes;
  double *local_d0;
  char savebuf [24];
  char recvbuf [48];
  CHRONO chrono;
  
  Bytes = 0;
  StartChrono(&chrono);
  recvbuf[0] = '\0';
  recvbuf[1] = '\0';
  recvbuf[2] = '\0';
  recvbuf[3] = '\0';
  recvbuf[4] = '\0';
  recvbuf[5] = '\0';
  recvbuf[6] = '\0';
  recvbuf[7] = '\0';
  recvbuf[8] = '\0';
  recvbuf[9] = '\0';
  recvbuf[10] = '\0';
  recvbuf[0xb] = '\0';
  recvbuf[0xc] = '\0';
  recvbuf[0xd] = '\0';
  recvbuf[0xe] = '\0';
  recvbuf[0xf] = '\0';
  recvbuf[0x10] = '\0';
  recvbuf[0x11] = '\0';
  recvbuf[0x12] = '\0';
  recvbuf[0x13] = '\0';
  recvbuf[0x14] = '\0';
  recvbuf[0x15] = '\0';
  recvbuf[0x16] = '\0';
  recvbuf[0x17] = '\0';
  recvbuf[0x18] = '\0';
  recvbuf[0x19] = '\0';
  recvbuf[0x1a] = '\0';
  recvbuf[0x1b] = '\0';
  recvbuf[0x1c] = '\0';
  recvbuf[0x1d] = '\0';
  recvbuf[0x1e] = '\0';
  recvbuf[0x1f] = '\0';
  recvbuf[0x20] = '\0';
  recvbuf[0x21] = '\0';
  recvbuf[0x22] = '\0';
  recvbuf[0x23] = '\0';
  recvbuf[0x24] = '\0';
  recvbuf[0x25] = '\0';
  recvbuf[0x26] = '\0';
  recvbuf[0x27] = '\0';
  recvbuf[0x28] = '\0';
  recvbuf[0x29] = '\0';
  recvbuf[0x2a] = '\0';
  recvbuf[0x2b] = '\0';
  recvbuf[0x2c] = '\0';
  recvbuf[0x2d] = '\0';
  recvbuf[0x2e] = '\0';
  recvbuf[0x2f] = '\0';
  savebuf[0] = '\0';
  savebuf[1] = '\0';
  savebuf[2] = '\0';
  savebuf[3] = '\0';
  savebuf[4] = '\0';
  savebuf[5] = '\0';
  savebuf[6] = '\0';
  savebuf[7] = '\0';
  savebuf[8] = '\0';
  savebuf[9] = '\0';
  savebuf[10] = '\0';
  savebuf[0xb] = '\0';
  savebuf[0xc] = '\0';
  savebuf[0xd] = '\0';
  savebuf[0xe] = '\0';
  savebuf[0xf] = '\0';
  savebuf[0x10] = '\0';
  savebuf[0x11] = '\0';
  savebuf[0x12] = '\0';
  savebuf[0x13] = '\0';
  savebuf[0x14] = '\0';
  savebuf[0x15] = '\0';
  savebuf[0x16] = '\0';
  savebuf[0x17] = '\0';
  iVar2 = ReadRS232Port(&pMES->RS232Port,(uint8 *)recvbuf,0x17,&Bytes);
  if (iVar2 == 0) {
    if ((pMES->bSaveRawData != 0) && ((FILE *)pMES->pfSaveFile != (FILE *)0x0)) {
      fwrite(recvbuf,(long)Bytes,1,(FILE *)pMES->pfSaveFile);
      fflush((FILE *)pMES->pfSaveFile);
    }
    local_d0 = pDistance;
    iVar2 = Bytes;
    if (0x16 < Bytes) {
      while (iVar2 = Bytes, Bytes == 0x17) {
        dVar5 = GetTimeElapsedChronoQuick(&chrono);
        if (4.0 < dVar5) goto LAB_00186f5e;
        memcpy(savebuf,recvbuf,(long)Bytes);
        iVar2 = ReadRS232Port(&pMES->RS232Port,(uint8 *)recvbuf,0x17,&Bytes);
        if (iVar2 != 0) goto LAB_00186d8b;
        if ((pMES->bSaveRawData != 0) && ((FILE *)pMES->pfSaveFile != (FILE *)0x0)) {
          fwrite(recvbuf,(long)Bytes,1,(FILE *)pMES->pfSaveFile);
          fflush((FILE *)pMES->pfSaveFile);
        }
      }
      __n = (size_t)Bytes;
      memmove(recvbuf + (0x17 - __n),recvbuf,__n);
      memcpy(recvbuf,savebuf + __n,(long)(0x17 - iVar2));
      iVar2 = 0x17;
    }
    pcVar4 = FindLatestMESMessage(recvbuf);
    while (pdVar1 = local_d0, pcVar4 == (char *)0x0) {
      dVar5 = GetTimeElapsedChronoQuick(&chrono);
      if (4.0 < dVar5) {
LAB_00186f5e:
        puts("Error reading data from a MES : Message timeout. ");
        return 2;
      }
      if (0x2e < iVar2) {
        puts("Error reading data from a MES : Invalid data. ");
        return 4;
      }
      iVar3 = ReadRS232Port(&pMES->RS232Port,(uint8 *)(recvbuf + iVar2),0x2f - iVar2,&Bytes);
      if (iVar3 != 0) goto LAB_00186d8b;
      if ((pMES->bSaveRawData != 0) && ((FILE *)pMES->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf + iVar2,(long)Bytes,1,(FILE *)pMES->pfSaveFile);
        fflush((FILE *)pMES->pfSaveFile);
      }
      iVar2 = iVar2 + Bytes;
      pcVar4 = FindLatestMESMessage(recvbuf);
    }
    iVar2 = __isoc99_sscanf(pcVar4,"%lfm\r\n",local_d0);
    if (iVar2 == 1) {
      pMES->LastDistance = *pdVar1;
      return 0;
    }
    pcVar4 = "Error reading data from a MES : Invalid data. ";
  }
  else {
LAB_00186d8b:
    pcVar4 = "Error reading data from a MES. ";
  }
  puts(pcVar4);
  return 1;
}

Assistant:

inline int GetLatestDataMES(MES* pMES, double* pDistance)
{
	char recvbuf[2*MAX_NB_BYTES_MES];
	char savebuf[MAX_NB_BYTES_MES];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_MES-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MES. \n");
		return EXIT_FAILURE;
	}
	if ((pMES->bSaveRawData)&&(pMES->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pMES->pfSaveFile);
		fflush(pMES->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MES)
			{
				printf("Error reading data from a MES : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a MES. \n");
				return EXIT_FAILURE;
			}
			if ((pMES->bSaveRawData)&&(pMES->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pMES->pfSaveFile);
				fflush(pMES->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr = FindLatestMESMessage(recvbuf);

	while (!ptr)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MES)
		{
			printf("Error reading data from a MES : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_MES-1)
		{
			printf("Error reading data from a MES : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_MES-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MES. \n");
			return EXIT_FAILURE;
		}
		if ((pMES->bSaveRawData)&&(pMES->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pMES->pfSaveFile);
			fflush(pMES->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr = FindLatestMESMessage(recvbuf);
	}

	// Analyze data.

	if (sscanf(ptr, "%lfm\r\n", pDistance) != 1)
	{
		printf("Error reading data from a MES : Invalid data. \n");
		return EXIT_FAILURE;
	}

	pMES->LastDistance = *pDistance;

	return EXIT_SUCCESS;
}